

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O1

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Data_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar7 = this->length;
  if (M->decoder_table == (uint *)0x0) {
    uVar3 = uVar7 >> 0xf;
    this->length = uVar3;
    uVar8 = M->data_symbols;
    uVar6 = uVar8 >> 1;
    uVar1 = 0;
    uVar2 = 0;
    do {
      uVar5 = M->distribution[uVar6] * uVar3;
      uVar9 = uVar6;
      if (uVar5 <= this->value) {
        uVar9 = uVar8;
        uVar1 = uVar5;
        uVar5 = uVar7;
        uVar2 = uVar6;
      }
      uVar7 = uVar5;
      uVar8 = uVar9;
      uVar6 = uVar2 + uVar8 >> 1;
    } while (uVar6 != uVar2);
  }
  else {
    uVar6 = uVar7 >> 0xf;
    this->length = uVar6;
    uVar1 = this->value / uVar6;
    uVar8 = uVar1 >> ((byte)M->table_shift & 0x1f);
    uVar2 = M->decoder_table[uVar8];
    uVar3 = M->decoder_table[uVar8 + 1] + 1;
    uVar8 = uVar2 + 1;
    if (uVar8 < uVar3) {
      do {
        uVar9 = uVar3 + uVar2 >> 1;
        uVar8 = uVar9;
        if (M->distribution[uVar9] <= uVar1) {
          uVar8 = uVar3;
          uVar2 = uVar9;
        }
        uVar3 = uVar8;
        uVar8 = uVar2 + 1;
      } while (uVar8 < uVar3);
    }
    uVar1 = M->distribution[uVar2] * uVar6;
    if (uVar2 != M->last_symbol) {
      uVar7 = uVar6 * M->distribution[uVar8];
    }
  }
  uVar8 = this->value - uVar1;
  this->value = uVar8;
  uVar7 = uVar7 - uVar1;
  this->length = uVar7;
  if (uVar7 < 0x1000000) {
    pbVar4 = this->ac_pointer;
    do {
      pbVar4 = pbVar4 + 1;
      this->ac_pointer = pbVar4;
      uVar8 = uVar8 << 8 | (uint)*pbVar4;
      this->value = uVar8;
      this->length = uVar7 << 8;
      bVar10 = uVar7 < 0x10000;
      uVar7 = uVar7 << 8;
    } while (bVar10);
  }
  return uVar2;
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Data_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned n, s, x, y = length;

      if (M.decoder_table) {              // use table look-up for faster decoding

        unsigned dv = value / (length >>= DM__LengthShift);
        unsigned t = dv >> M.table_shift;

        s = M.decoder_table[t];         // initial decision based on table look-up
        n = M.decoder_table[t+1] + 1;

        while (n > s + 1) {                        // finish with bisection search
          unsigned m = (s + n) >> 1;
          if (M.distribution[m] > dv) n = m; else s = m;
        }
                                                               // compute products
        x = M.distribution[s] * length;
        if (s != M.last_symbol) y = M.distribution[s+1] * length;
      }

      else {                                  // decode using only multiplications

        x = s = 0;
        length >>= DM__LengthShift;
        unsigned m = (n = M.data_symbols) >> 1;
                                                    // decode via bisection search
        do {
          unsigned z = length * M.distribution[m];
          if (z > value) {
            n = m;
            y = z;                                             // value is smaller
          }
          else {
            s = m;
            x = z;                                     // value is larger or equal
          }
        } while ((m = (s + n) >> 1) != s);
      }

      value -= x;                                               // update interval
      length = y - x;

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return s;
    }